

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

uint __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          size_t escapeOffset)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = 0;
  iVar5 = 4;
  while( true ) {
    cVar1 = *is->current_;
    uVar4 = uVar4 * 0x10 + (int)cVar1;
    iVar3 = -0x30;
    if ((((byte)(cVar1 - 0x30U) < 10) || (iVar3 = -0x37, (byte)(cVar1 + 0xbfU) < 6)) ||
       (iVar3 = -0x57, (byte)(cVar1 + 0x9fU) < 6)) {
      uVar4 = uVar4 + iVar3;
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      bVar2 = true;
    }
    else {
      *(undefined4 *)(this + 0x30) = 8;
      *(size_t *)(this + 0x38) = escapeOffset;
      bVar2 = false;
    }
    if (!bVar2) break;
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      return uVar4;
    }
  }
  return 0;
}

Assistant:

unsigned ParseHex4(InputStream& is, size_t escapeOffset) {
        unsigned codepoint = 0;
        for (int i = 0; i < 4; i++) {
            Ch c = is.Peek();
            codepoint <<= 4;
            codepoint += static_cast<unsigned>(c);
            if (c >= '0' && c <= '9')
                codepoint -= '0';
            else if (c >= 'A' && c <= 'F')
                codepoint -= 'A' - 10;
            else if (c >= 'a' && c <= 'f')
                codepoint -= 'a' - 10;
            else {
                RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorStringUnicodeEscapeInvalidHex, escapeOffset);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(0);
            }
            is.Take();
        }
        return codepoint;
    }